

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

ArrayNewFixed * __thiscall
wasm::Builder::makeArrayNewFixed
          (Builder *this,HeapType type,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *values)

{
  ArrayNewFixed *pAVar1;
  MixedArena *this_00;
  Type local_30;
  
  this_00 = &this->wasm->allocator;
  pAVar1 = (ArrayNewFixed *)MixedArena::allocSpace(this_00,0x30,8);
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id =
       ArrayNewFixedId;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id = 0;
  (pAVar1->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (pAVar1->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pAVar1->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pAVar1->values).allocator = this_00;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pAVar1->values,
             values);
  ::wasm::Type::Type(&local_30,type,NonNullable);
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id =
       local_30.id;
  ::wasm::ArrayNewFixed::finalize();
  return pAVar1;
}

Assistant:

ArrayNewFixed* makeArrayNewFixed(HeapType type,
                                   const std::vector<Expression*>& values) {
    auto* ret = wasm.allocator.alloc<ArrayNewFixed>();
    ret->values.set(values);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }